

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

opj_bool jp2_decode_v2(opj_jp2_v2_t *jp2,opj_stream_private *cio,opj_image_t *p_image,
                      opj_event_mgr *p_manager)

{
  opj_event_mgr_t *in_RCX;
  opj_event_mgr_t *in_RDX;
  opj_image_t *in_RSI;
  opj_stream_private_t *in_RDI;
  opj_jp2_color_t *in_stack_00000028;
  opj_image_t *in_stack_00000030;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  opj_bool oVar1;
  
  if (in_RDX == (opj_event_mgr_t *)0x0) {
    oVar1 = 0;
  }
  else {
    oVar1 = j2k_decode_v2((opj_j2k_v2_t *)
                          CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                          in_RSI,in_RDX);
    if (oVar1 == 0) {
      opj_event_msg_v2(in_RCX,1,"Failed to decode the codestream in the JP2 file\n");
      oVar1 = 0;
    }
    else {
      if (*(int *)((long)&in_RDI->m_current_data + 4) == 0x10) {
        *(undefined4 *)((long)&in_RDX->warning_handler + 4) = 1;
      }
      else if (*(int *)((long)&in_RDI->m_current_data + 4) == 0x11) {
        *(undefined4 *)((long)&in_RDX->warning_handler + 4) = 2;
      }
      else if (*(int *)((long)&in_RDI->m_current_data + 4) == 0x12) {
        *(undefined4 *)((long)&in_RDX->warning_handler + 4) = 3;
      }
      else {
        *(undefined4 *)((long)&in_RDX->warning_handler + 4) = 0xffffffff;
      }
      if (in_RDI[1].m_write_fn != (opj_stream_write_fn)0x0) {
        jp2_apply_cdef(in_stack_00000030,in_stack_00000028);
      }
      if (in_RDI[1].m_skip_fn != (opj_stream_skip_fn)0x0) {
        if (*(long *)(in_RDI[1].m_skip_fn + 0x18) == 0) {
          jp2_free_pclr((opj_jp2_color_t *)0x145f2d);
        }
        else {
          jp2_apply_pclr(in_stack_00000030,in_stack_00000028);
        }
      }
      if (in_RDI[1].m_user_data_length != 0) {
        in_RDX[1].client_data = (void *)in_RDI[1].m_user_data_length;
        *(undefined4 *)&in_RDX[1].error_handler = *(undefined4 *)&in_RDI[1].m_read_fn;
        in_RDI[1].m_user_data_length = 0;
      }
      oVar1 = 1;
    }
  }
  return oVar1;
}

Assistant:

opj_bool jp2_decode_v2(	opj_jp2_v2_t *jp2,
						struct opj_stream_private *cio,
						opj_image_t* p_image,
						struct opj_event_mgr * p_manager)
{
	if (!p_image)
		return OPJ_FALSE;

	/* J2K decoding */
	if( ! j2k_decode_v2(jp2->j2k, cio, p_image, p_manager) ) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Failed to decode the codestream in the JP2 file\n");
		return OPJ_FALSE;
	}

	/* Set Image Color Space */
	if (jp2->enumcs == 16)
		p_image->color_space = CLRSPC_SRGB;
	else if (jp2->enumcs == 17)
		p_image->color_space = CLRSPC_GRAY;
	else if (jp2->enumcs == 18)
		p_image->color_space = CLRSPC_SYCC;
	else
		p_image->color_space = CLRSPC_UNKNOWN;

	/* Apply the color space if needed */
	if(jp2->color.jp2_cdef) {
		jp2_apply_cdef(p_image, &(jp2->color));
	}

	if(jp2->color.jp2_pclr) {
		/* Part 1, I.5.3.4: Either both or none : */
		if( !jp2->color.jp2_pclr->cmap)
			jp2_free_pclr(&(jp2->color));
		else
			jp2_apply_pclr(p_image, &(jp2->color));
	}

	if(jp2->color.icc_profile_buf) {
		p_image->icc_profile_buf = jp2->color.icc_profile_buf;
		p_image->icc_profile_len = jp2->color.icc_profile_len;
		jp2->color.icc_profile_buf = NULL;
	}

	return OPJ_TRUE;
}